

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caption.c
# Opt level: O3

size_t caption_frame_dump_buffer(caption_frame_t *frame,utf8_char_t *buf)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  char *__s;
  utf8_char_t *puVar5;
  long lVar6;
  utf8_char_t *puVar7;
  utf8_char_t *puVar8;
  utf8_char_t *puVar9;
  long lVar10;
  
  iVar1 = sprintf(buf,"   timestamp: %f\n   row: %02d    col: %02d    roll-up: %d\n",
                  frame->timestamp,(ulong)(uint)(int)(frame->state).row,
                  (ulong)(uint)(int)(frame->state).col,
                  (ulong)*(uint *)((long)_caption_frame_rollup +
                                  (ulong)(*(byte *)&frame->state >> 2 & 0xc)));
  iVar2 = sprintf(buf + iVar1,
                  "   00000000001111111111222222222233\t   00000000001111111111222222222233\n   01234567890123456789012345678901\t   01234567890123456789012345678901\n  %s--------------------------------%s\t  %s--------------------------------%s\n"
                  ,anon_var_dwarf_1d7b,anon_var_dwarf_1d86,anon_var_dwarf_1d7b,anon_var_dwarf_1d86);
  lVar10 = (long)iVar1 + (long)iVar2;
  __s = buf + iVar1 + iVar2;
  puVar8 = (frame->front).cell[0][0].data;
  puVar9 = (frame->back).cell[0][0].data;
  lVar4 = 0;
  do {
    iVar1 = sprintf(__s,"%02d%s",lVar4,"|");
    lVar10 = lVar10 + iVar1;
    puVar5 = __s + iVar1;
    lVar6 = 0;
    do {
      puVar7 = " ";
      if (puVar8[lVar6] != '\0') {
        puVar7 = puVar8 + lVar6;
      }
      sVar3 = utf8_char_copy(puVar5,puVar7);
      lVar10 = lVar10 + sVar3;
      puVar5 = puVar5 + sVar3;
      lVar6 = lVar6 + 8;
    } while (lVar6 != 0x100);
    iVar1 = sprintf(puVar5,"%s\t%02d%s","|",lVar4,"|");
    lVar10 = lVar10 + iVar1;
    puVar5 = puVar5 + iVar1;
    lVar6 = 0;
    do {
      puVar7 = " ";
      if (puVar9[lVar6] != '\0') {
        puVar7 = puVar9 + lVar6;
      }
      sVar3 = utf8_char_copy(puVar5,puVar7);
      lVar10 = lVar10 + sVar3;
      puVar5 = puVar5 + sVar3;
      lVar6 = lVar6 + 8;
    } while (lVar6 != 0x100);
    iVar1 = sprintf(puVar5,"%s\n","|");
    lVar10 = lVar10 + iVar1;
    __s = puVar5 + iVar1;
    lVar4 = lVar4 + 1;
    puVar8 = puVar8 + 0x100;
    puVar9 = puVar9 + 0x100;
  } while (lVar4 != 0xf);
  iVar1 = sprintf(__s,
                  "  %s--------------------------------%s\t  %s--------------------------------%s\n"
                  ,anon_var_dwarf_1e03,anon_var_dwarf_1e0e,anon_var_dwarf_1e03,anon_var_dwarf_1e0e);
  return lVar10 + iVar1;
}

Assistant:

size_t caption_frame_dump_buffer(caption_frame_t* frame, utf8_char_t* buf)
{
    int r, c;
    size_t bytes, total = 0;
    bytes = sprintf(buf, "   timestamp: %f\n   row: %02d    col: %02d    roll-up: %d\n",
        frame->timestamp, frame->state.row, frame->state.col, caption_frame_rollup(frame));
    total += bytes, buf += bytes;
    bytes = sprintf(buf, "   00000000001111111111222222222233\t   00000000001111111111222222222233\n"
                         "   01234567890123456789012345678901\t   01234567890123456789012345678901\n"
                         "  %s--------------------------------%s\t  %s--------------------------------%s\n",
        EIA608_CHAR_BOX_DRAWINGS_LIGHT_DOWN_AND_RIGHT, EIA608_CHAR_BOX_DRAWINGS_LIGHT_DOWN_AND_LEFT,
        EIA608_CHAR_BOX_DRAWINGS_LIGHT_DOWN_AND_RIGHT, EIA608_CHAR_BOX_DRAWINGS_LIGHT_DOWN_AND_LEFT);
    total += bytes;
    buf += bytes;

    for (r = 0; r < SCREEN_ROWS; ++r) {
        bytes = sprintf(buf, "%02d%s", r, EIA608_CHAR_VERTICAL_LINE);
        total += bytes, buf += bytes;

        // front buffer
        for (c = 0; c < SCREEN_COLS; ++c) {
            caption_frame_cell_t* cell = frame_buffer_cell(&frame->front, r, c);
            bytes = utf8_char_copy(buf, (!cell || 0 == cell->data[0]) ? EIA608_CHAR_SPACE : &cell->data[0]);
            total += bytes, buf += bytes;
        }

        bytes = sprintf(buf, "%s\t%02d%s", EIA608_CHAR_VERTICAL_LINE, r, EIA608_CHAR_VERTICAL_LINE);
        total += bytes, buf += bytes;

        // back buffer
        for (c = 0; c < SCREEN_COLS; ++c) {
            caption_frame_cell_t* cell = frame_buffer_cell(&frame->back, r, c);
            bytes = utf8_char_copy(buf, (!cell || 0 == cell->data[0]) ? EIA608_CHAR_SPACE : &cell->data[0]);
            total += bytes, buf += bytes;
        }

        bytes = sprintf(buf, "%s\n", EIA608_CHAR_VERTICAL_LINE);
        total += bytes, buf += bytes;
    }

    bytes = sprintf(buf, "  %s--------------------------------%s\t  %s--------------------------------%s\n",
        EIA608_CHAR_BOX_DRAWINGS_LIGHT_UP_AND_RIGHT, EIA608_CHAR_BOX_DRAWINGS_LIGHT_UP_AND_LEFT,
        EIA608_CHAR_BOX_DRAWINGS_LIGHT_UP_AND_RIGHT, EIA608_CHAR_BOX_DRAWINGS_LIGHT_UP_AND_LEFT);
    total += bytes, buf += bytes;
    return total;
}